

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall cfgfile::generator::cpp_generator_t::generate(cpp_generator_t *this,ostream *stream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  namespace_t *pnVar3;
  pointer pfVar4;
  field_t *pfVar5;
  namespace_t **ppnVar6;
  uint uVar7;
  iterator iVar8;
  namespace_t **ppnVar9;
  field_type_t fVar10;
  string *psVar11;
  long *plVar12;
  ostream *poVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  const_class_ptr_t this_00;
  namespace_t **ppnVar15;
  vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  *pvVar16;
  undefined8 *puVar17;
  long *plVar18;
  namespace_t **ppnVar19;
  field_t *f_00;
  field_t *f_01;
  field_t *f_02;
  field_t *f_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  const_namespace_ptr_t *n_1;
  iterator iVar20;
  field_t *f;
  field_t *this_01;
  pointer pfVar21;
  int iVar22;
  string *incl;
  pointer pbVar23;
  namespace_stack_t tmp;
  const_namespace_ptr_t n;
  string guard;
  pointer *local_168;
  pointer local_160;
  pointer local_158;
  undefined4 local_150;
  undefined1 local_14c;
  ostream *local_148;
  string local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_120;
  long *local_118;
  long local_110;
  long local_108;
  undefined8 uStack_100;
  string local_f8;
  namespace_t **local_d8;
  const_class_ptr_t local_d0;
  char *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined2 uStack_b2;
  undefined6 uStack_b0;
  undefined1 local_aa;
  namespace_t **local_a8;
  iterator iStack_a0;
  namespace_t **local_98;
  cpp_generator_t *local_88;
  namespace_t *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  unsigned_long_long local_58;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined2 local_38;
  undefined1 local_36;
  
  local_148 = stream;
  local_88 = this;
  psVar11 = cfg::model_t::include_guard_abi_cxx11_(this->m_model);
  local_168 = &local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"__INCLUDED","");
  plVar12 = (long *)std::__cxx11::string::replace
                              ((ulong)&local_168,0,(char *)0x0,(ulong)(psVar11->_M_dataplus)._M_p);
  local_78 = &local_68;
  plVar18 = plVar12 + 2;
  if ((long *)*plVar12 == plVar18) {
    local_68 = *plVar18;
    lStack_60 = plVar12[3];
  }
  else {
    local_68 = *plVar18;
    local_78 = (long *)*plVar12;
  }
  local_70 = plVar12[1];
  *plVar12 = (long)plVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  if (local_168 != &local_158) {
    operator_delete(local_168,(ulong)(local_158 + 1));
  }
  local_168 = &local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"\n#ifndef ","");
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_148,(char *)local_168,(long)local_160);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)local_78,local_70);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"\n#define ","");
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,local_140._M_dataplus._M_p,local_140._M_string_length);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)local_78,local_70);
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"\n\n","");
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)local_118,local_110);
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,(ulong)(local_158 + 1));
  }
  pvVar14 = cfg::model_t::global_includes_abi_cxx11_(local_88->m_model);
  local_120 = cfg::model_t::relative_includes_abi_cxx11_(local_88->m_model);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_148,"// cfgfile include.\n#include <cfgfile/all.hpp>\n\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>(local_148,"// C++ include.\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(local_148,"#include <vector>\n\n",0x13);
  pbVar2 = (pvVar14->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar23 = (pvVar14->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar23 != pbVar2;
      pbVar23 = pbVar23 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_148,"#include <",10);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_148,(pbVar23->_M_dataplus)._M_p,pbVar23->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,">\n",2);
  }
  if ((pvVar14->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar14->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(local_148,"\n",1);
  }
  pvVar14 = local_120;
  pbVar2 = (local_120->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar23 = (local_120->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar23 != pbVar2;
      pbVar23 = pbVar23 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_148,"#include \"",10);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_148,(pbVar23->_M_dataplus)._M_p,pbVar23->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"\n",2);
  }
  if ((pvVar14->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar14->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(local_148,"\n",1);
  }
  local_d8 = (namespace_t **)0x0;
  iVar20._M_current = (namespace_t **)0x0;
  local_120 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0;
  local_58 = 0;
  do {
    this_00 = cfg::model_t::next_class(local_88->m_model,local_58);
    if (this_00 == (const_class_ptr_t)0x0) {
      for (; (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)iVar20._M_current != local_120; iVar20._M_current = iVar20._M_current + -1) {
        std::__ostream_insert<char,std::char_traits<char>>(local_148,"} /* namespace ",0xf);
        psVar11 = cfg::namespace_t::name_abi_cxx11_(iVar20._M_current[-1]);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_148,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," */\n\n",5);
      }
      local_168 = &local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"#endif // ","");
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_148,(char *)local_168,(long)local_160);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,(char *)local_78,local_70);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"\n","");
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,local_140._M_dataplus._M_p,local_140._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168,(ulong)(local_158 + 1));
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_120 !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        operator_delete(local_120,(long)local_d8 - (long)local_120);
      }
      return;
    }
    local_a8 = (namespace_t **)0x0;
    iStack_a0._M_current = (namespace_t **)0x0;
    local_98 = (namespace_t **)0x0;
    local_d0 = this_00;
    local_80 = cfg::class_t::parent_namespace(this_00);
    local_58 = local_58 + 1;
    for (; local_80 != (namespace_t *)0x0; local_80 = cfg::namespace_t::parent_namespace(local_80))
    {
      psVar11 = cfg::namespace_t::name_abi_cxx11_(local_80);
      if (psVar11->_M_string_length != 0) {
        if (iStack_a0._M_current == local_98) {
          std::
          vector<cfgfile::generator::cfg::namespace_t_const*,std::allocator<cfgfile::generator::cfg::namespace_t_const*>>
          ::_M_realloc_insert<cfgfile::generator::cfg::namespace_t_const*const&>
                    ((vector<cfgfile::generator::cfg::namespace_t_const*,std::allocator<cfgfile::generator::cfg::namespace_t_const*>>
                      *)&local_a8,iStack_a0,&local_80);
        }
        else {
          *iStack_a0._M_current = local_80;
          iStack_a0._M_current = iStack_a0._M_current + 1;
        }
      }
    }
    local_80 = (namespace_t *)0x0;
    if (local_a8 == iStack_a0._M_current) {
      for (; (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)iVar20._M_current != local_120; iVar20._M_current = iVar20._M_current + -1) {
        std::__ostream_insert<char,std::char_traits<char>>(local_148,"} /* namespace ",0xf);
        psVar11 = cfg::namespace_t::name_abi_cxx11_(iVar20._M_current[-1]);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_148,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," */\n\n",5);
      }
    }
    else {
      ppnVar19 = iStack_a0._M_current + -1;
      local_80 = (namespace_t *)0x0;
      ppnVar6 = local_a8;
      if (local_a8 < ppnVar19) {
        do {
          ppnVar15 = ppnVar6 + 1;
          pnVar3 = *ppnVar6;
          *ppnVar6 = *ppnVar19;
          *ppnVar19 = pnVar3;
          ppnVar19 = ppnVar19 + -1;
          ppnVar6 = ppnVar15;
        } while (ppnVar15 < ppnVar19);
      }
      while (ppnVar15 = local_98, iVar8._M_current = iStack_a0._M_current, ppnVar19 = local_a8,
            pvVar14 = local_120, ppnVar9 = local_d8, ppnVar6 = local_a8,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)iVar20._M_current != local_120) {
        if (iVar20._M_current[-1] == iStack_a0._M_current[-1]) {
          pvVar14 = local_120;
          ppnVar9 = local_d8;
          if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)iVar20._M_current != local_120) goto LAB_00115b43;
          break;
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_148,"} /* namespace ",0xf);
        iVar20._M_current = iVar20._M_current + -1;
        psVar11 = cfg::namespace_t::name_abi_cxx11_(*iVar20._M_current);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_148,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," */\n\n",5);
      }
      for (; local_98 = ppnVar9, local_a8 = (namespace_t **)pvVar14,
          iStack_a0._M_current = iVar20._M_current, ppnVar6 != iVar8._M_current;
          ppnVar6 = ppnVar6 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>(local_148,"namespace ",10);
        psVar11 = cfg::namespace_t::name_abi_cxx11_(*ppnVar6);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_148,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," {\n\n",4);
        iVar20._M_current = iStack_a0._M_current;
        pvVar14 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8;
        ppnVar9 = local_98;
      }
      local_d8 = ppnVar15;
      local_120 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)ppnVar19;
      iVar20._M_current = iVar8._M_current;
    }
LAB_00115b43:
    local_168 = &local_158;
    local_160 = (pointer)0x6;
    local_158 = (pointer)CONCAT17(local_158._7_1_,0x202f2f0a2f2f);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)local_168,6);
    psVar11 = cfg::class_t::name_abi_cxx11_(local_d0);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
    paVar1 = &local_140.field_2;
    local_140._M_string_length = 5;
    local_140.field_2._M_allocated_capacity._0_6_ = 0xa0a2f2f0a;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,paVar1->_M_local_buf,5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,(ulong)(local_158 + 1));
    }
    local_168 = &local_158;
    local_160 = (pointer)0x6;
    local_158 = (pointer)CONCAT17(local_158._7_1_,0x207373616c63);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)local_168,6);
    psVar11 = cfg::class_t::name_abi_cxx11_(local_d0);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
    paVar1 = &local_140.field_2;
    local_140._M_string_length = 3;
    local_140.field_2._M_allocated_capacity._0_4_ = 0xa7b20;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,paVar1->_M_local_buf,3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,(ulong)(local_158 + 1));
    }
    local_158 = (pointer)0xa3a63696c627570;
    local_160 = (pointer)0x8;
    local_150 = local_150 & 0xffffff00;
    local_168 = &local_158;
    std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)&local_158,8);
    if (local_168 != &local_158) {
      operator_delete(local_168,(ulong)(local_158 + 1));
    }
    local_168 = &local_158;
    local_158 = (pointer)CONCAT62(local_158._2_6_,9);
    local_160 = (pointer)0x1;
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)local_168,1);
    psVar11 = cfg::class_t::name_abi_cxx11_(local_d0);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
    paVar1 = &local_140.field_2;
    local_140._M_string_length = 3;
    local_140.field_2._M_allocated_capacity._0_4_ = 0xa2928;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,paVar1->_M_local_buf,3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,(ulong)(local_158 + 1));
    }
    pvVar16 = cfg::class_t::fields(local_d0);
    pfVar21 = (pvVar16->
              super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pfVar4 = (pvVar16->
             super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pfVar21 != pfVar4) {
      iVar22 = 0;
      do {
        psVar11 = cfg::field_t::default_value_abi_cxx11_(pfVar21);
        if (psVar11->_M_string_length != 0) {
          local_168 = &local_158;
          if (iVar22 == 0) {
            local_160 = (pointer)0x3;
            local_158 = (pointer)CONCAT44(local_158._4_4_,0x3a0909);
            std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)&local_158,3);
          }
          else {
            local_160 = (pointer)0x3;
            local_158 = (pointer)CONCAT44(local_158._4_4_,0x2c0909);
            std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)&local_158,3);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,(ulong)(local_158 + 1));
          }
          local_168 = &local_158;
          local_160 = (pointer)0x3;
          local_158 = (pointer)CONCAT44(local_158._4_4_,0x5f6d09);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_148,(char *)local_168,3);
          psVar11 = cfg::field_t::name_abi_cxx11_(pfVar21);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          local_140._M_string_length = 2;
          local_140.field_2._M_allocated_capacity._0_3_ = 0x2028;
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,local_140._M_dataplus._M_p,2);
          psVar11 = cfg::field_t::default_value_abi_cxx11_(pfVar21);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
          local_110 = 3;
          local_108 = CONCAT44(local_108._4_4_,0xa2920);
          local_118 = &local_108;
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_108,3);
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,(ulong)(local_158 + 1));
          }
          iVar22 = iVar22 + 1;
        }
        pfVar21 = pfVar21 + 1;
      } while (pfVar21 != pfVar4);
    }
    local_168 = &local_158;
    local_158 = (pointer)0x7e090a7d090a7b09;
    local_160 = (pointer)0x8;
    local_150 = local_150 & 0xffffff00;
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)local_168,8);
    psVar11 = cfg::class_t::name_abi_cxx11_(local_d0);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
    paVar1 = &local_140.field_2;
    local_140.field_2._M_allocated_capacity = 0x7d090a7b090a2928;
    local_140.field_2._8_2_ = 0xa0a;
    local_140._M_string_length = 10;
    local_140.field_2._M_local_buf[10] = '\0';
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,paVar1->_M_local_buf,10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,(ulong)(local_158 + 1));
    }
    pvVar16 = cfg::class_t::fields(local_d0);
    pfVar5 = (pvVar16->
             super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (pvVar16->
                   super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
                   )._M_impl.super__Vector_impl_data._M_start; this_01 != pfVar5;
        this_01 = this_01 + 1) {
      fVar10 = cfg::field_t::type(this_01);
      local_168 = &local_158;
      if (fVar10 == no_value_field_type) {
        local_160 = (pointer)0x6;
        local_158 = (pointer)CONCAT17(local_158._7_1_,0x206c6f6f6209);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)local_168,6);
        psVar11 = cfg::field_t::name_abi_cxx11_(this_01);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        local_118 = (long *)0x17;
        local_140._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_140,(ulong)&local_118);
        local_140.field_2._M_allocated_capacity = (size_type)local_118;
        builtin_strncpy(local_140._M_dataplus._M_p,"() const\n\t{\n\t\treturn m_",0x17);
        local_140._M_string_length = (size_type)local_118;
        local_140._M_dataplus._M_p[(long)local_118] = '\0';
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_140._M_dataplus._M_p,(long)local_118);
        psVar11 = cfg::field_t::name_abi_cxx11_(this_01);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        local_110 = 5;
        local_108 = CONCAT26(local_108._6_2_,0xa7d090a3b);
        local_118 = &local_108;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_108,5);
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if (local_168 != &local_158) {
          operator_delete(local_168,(ulong)(local_158 + 1));
        }
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        local_140._M_string_length = 6;
        local_140.field_2._M_allocated_capacity._0_7_ = 0x2064696f7609;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_148,local_140._M_dataplus._M_p,6);
        psVar11 = cfg::field_t::name_abi_cxx11_(this_01);
        local_168 = &local_158;
        local_160 = (pointer)0x4;
        local_158 = (pointer)CONCAT35(local_158._5_3_,0x5f746573);
        puVar17 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_168,(ulong)(psVar11->_M_dataplus)._M_p);
        plVar12 = puVar17 + 2;
        if ((long *)*puVar17 == plVar12) {
          local_108 = *plVar12;
          uStack_100 = puVar17[3];
          local_118 = &local_108;
        }
        else {
          local_108 = *plVar12;
          local_118 = (long *)*puVar17;
        }
        local_110 = puVar17[1];
        *puVar17 = plVar12;
        puVar17[1] = 0;
        *(undefined1 *)(puVar17 + 2) = 0;
        if (local_168 != &local_158) {
          operator_delete(local_168,(ulong)(local_158 + 1));
        }
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(char *)local_118,local_110);
        local_168 = &local_158;
        local_f8._M_dataplus._M_p = (pointer)0x19;
        local_168 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_168,(ulong)&local_f8)
        ;
        local_158 = local_f8._M_dataplus._M_p;
        builtin_strncpy((char *)((long)local_168 + 9),"= true )",8);
        builtin_strncpy((char *)((long)local_168 + 0x11),"\n\t{\n\t\tm_",8);
        *local_168 = (pointer)0x76206c6f6f622028;
        local_168[1] = (pointer)0x2065757274203d20;
        local_160 = local_f8._M_dataplus._M_p;
        *(char *)((long)local_168 + (long)local_f8._M_dataplus._M_p) = '\0';
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(char *)local_168,(long)local_f8._M_dataplus._M_p);
        psVar11 = cfg::field_t::name_abi_cxx11_(this_01);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        paVar1 = &local_f8.field_2;
        local_f8.field_2._M_allocated_capacity = 0x7d090a3b76203d20;
        local_f8.field_2._8_2_ = 0xa0a;
        local_f8._M_string_length = 10;
        local_f8.field_2._M_local_buf[10] = '\0';
        local_f8._M_dataplus._M_p = (pointer)paVar1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,paVar1->_M_local_buf,10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar1) {
LAB_001167e7:
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_158 = (pointer)0x2074736e6f6309;
        local_160 = (pointer)0x7;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)local_168,7);
        generate_type_of_data_abi_cxx11_(&local_140,(generator *)this_01,f_00);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_140._M_dataplus._M_p,local_140._M_string_length);
        local_110 = 3;
        local_108 = CONCAT44(local_108._4_4_,0x202620);
        local_118 = &local_108;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_108,3);
        psVar11 = cfg::field_t::name_abi_cxx11_(this_01);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_c8 = (char *)0x17;
        local_f8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_f8,(ulong)&local_c8);
        local_f8.field_2._M_allocated_capacity = (size_type)local_c8;
        builtin_strncpy(local_f8._M_dataplus._M_p,"() const\n\t{\n\t\treturn m_",0x17);
        local_f8._M_string_length = (size_type)local_c8;
        local_f8._M_dataplus._M_p[(long)local_c8] = '\0';
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_f8._M_dataplus._M_p,(long)local_c8);
        psVar11 = cfg::field_t::name_abi_cxx11_(this_01);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        uStack_b4 = 10;
        local_b8 = 0x7d090a3b;
        local_c0 = 5;
        uStack_b3 = 0;
        local_c8 = (char *)&local_b8;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_b8,5);
        if (local_c8 != (char *)&local_b8) {
          operator_delete(local_c8,CONCAT26(uStack_b2,
                                            CONCAT15(uStack_b3,CONCAT14(uStack_b4,local_b8))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if (local_168 != &local_158) {
          operator_delete(local_168,(ulong)(local_158 + 1));
        }
        local_168 = &local_158;
        local_158 = (pointer)CONCAT62(local_158._2_6_,9);
        local_160 = (pointer)0x1;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)local_168,1);
        generate_type_of_data_abi_cxx11_(&local_140,(generator *)this_01,f_01);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_140._M_dataplus._M_p,local_140._M_string_length);
        local_110 = 3;
        local_108 = CONCAT44(local_108._4_4_,0x202620);
        local_118 = &local_108;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_108,3);
        psVar11 = cfg::field_t::name_abi_cxx11_(this_01);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_c8 = (char *)0x11;
        local_f8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_f8,(ulong)&local_c8);
        local_f8.field_2._M_allocated_capacity = (size_type)local_c8;
        *(undefined8 *)local_f8._M_dataplus._M_p = 0x9090a7b090a2928;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 8) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 10) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0xb) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0xc) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0xd) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0xe) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0xf) = 'm';
        local_f8._M_dataplus._M_p[0x10] = '_';
        local_f8._M_string_length = (size_type)local_c8;
        local_f8._M_dataplus._M_p[(long)local_c8] = '\0';
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_f8._M_dataplus._M_p,(long)local_c8);
        psVar11 = cfg::field_t::name_abi_cxx11_(this_01);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        uStack_b4 = 10;
        local_b8 = 0x7d090a3b;
        local_c0 = 5;
        uStack_b3 = 0;
        local_c8 = (char *)&local_b8;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_b8,5);
        if (local_c8 != (char *)&local_b8) {
          operator_delete(local_c8,CONCAT26(uStack_b2,
                                            CONCAT15(uStack_b3,CONCAT14(uStack_b4,local_b8))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if (local_168 != &local_158) {
          operator_delete(local_168,(ulong)(local_158 + 1));
        }
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        local_140._M_string_length = 6;
        local_140.field_2._M_allocated_capacity._0_7_ = 0x2064696f7609;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_148,local_140._M_dataplus._M_p,6);
        psVar11 = cfg::field_t::name_abi_cxx11_(this_01);
        local_168 = &local_158;
        local_160 = (pointer)0x4;
        local_158 = (pointer)CONCAT35(local_158._5_3_,0x5f746573);
        puVar17 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_168,(ulong)(psVar11->_M_dataplus)._M_p);
        plVar12 = puVar17 + 2;
        if ((long *)*puVar17 == plVar12) {
          local_108 = *plVar12;
          uStack_100 = puVar17[3];
          local_118 = &local_108;
        }
        else {
          local_108 = *plVar12;
          local_118 = (long *)*puVar17;
        }
        local_110 = puVar17[1];
        *puVar17 = plVar12;
        puVar17[1] = 0;
        *(undefined1 *)(puVar17 + 2) = 0;
        if (local_168 != &local_158) {
          operator_delete(local_168,(ulong)(local_158 + 1));
        }
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(char *)local_118,local_110);
        local_168 = &local_158;
        local_158 = (pointer)0x2074736e6f632028;
        local_160 = (pointer)0x8;
        local_150 = local_150 & 0xffffff00;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)local_168,8);
        generate_type_of_data_abi_cxx11_(&local_f8,(generator *)this_01,f_02);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_f8._M_dataplus._M_p,local_f8._M_string_length);
        local_c8 = (char *)&local_b8;
        uStack_b0 = 0x5f6d09090a7b;
        local_b8 = 0x76202620;
        uStack_b4 = 0x20;
        uStack_b3 = 0x29;
        uStack_b2 = 0x90a;
        local_c0 = 0xe;
        local_aa = 0;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_c8,0xe);
        psVar11 = cfg::field_t::name_abi_cxx11_(this_01);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        local_40 = 0x7d090a3b76203d20;
        local_38 = 0xa0a;
        local_48 = 10;
        local_36 = 0;
        local_50 = &local_40;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_40,10);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        if (local_c8 != (char *)&local_b8) {
          operator_delete(local_c8,CONCAT26(uStack_b2,
                                            CONCAT15(uStack_b3,CONCAT14(uStack_b4,local_b8))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_001167e7;
      }
      if (local_168 != &local_158) {
        operator_delete(local_168,(ulong)(local_158 + 1));
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
    }
    local_158 = (pointer)0x3a65746176697270;
    local_160 = (pointer)0x9;
    uVar7 = local_150 >> 0x10;
    local_150 = CONCAT22((short)uVar7,10);
    local_168 = &local_158;
    std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)&local_158,9);
    if (local_168 != &local_158) {
      operator_delete(local_168,(ulong)(local_158 + 1));
    }
    pvVar16 = cfg::class_t::fields(local_d0);
    pfVar4 = (pvVar16->
             super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pfVar21 = (pvVar16->
                   super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
                   )._M_impl.super__Vector_impl_data._M_start; local_168 = &local_158,
        pfVar21 != pfVar4; pfVar21 = pfVar21 + 1) {
      local_158 = (pointer)CONCAT62(local_158._2_6_,9);
      local_160 = (pointer)0x1;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)local_168,1);
      generate_type_of_data_abi_cxx11_(&local_140,(generator *)pfVar21,f_03);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_140._M_dataplus._M_p,local_140._M_string_length);
      local_110 = 3;
      local_108 = CONCAT44(local_108._4_4_,0x5f6d20);
      local_118 = &local_108;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_108,3);
      psVar11 = cfg::field_t::name_abi_cxx11_(pfVar21);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
      paVar1 = &local_f8.field_2;
      local_f8._M_string_length = 2;
      local_f8.field_2._M_allocated_capacity._0_3_ = 0xa3b;
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,paVar1->_M_local_buf,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168,(ulong)(local_158 + 1));
      }
    }
    local_158 = (pointer)0x6c63202f2f203b7d;
    local_150 = 0x20737361;
    local_160 = (pointer)0xc;
    local_14c = 0;
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>(local_148,(char *)local_168,0xc);
    psVar11 = cfg::class_t::name_abi_cxx11_(local_d0);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
    paVar1 = &local_140.field_2;
    local_140._M_string_length = 3;
    local_140.field_2._M_allocated_capacity._0_4_ = 0xa0a0a;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,paVar1->_M_local_buf,3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,(ulong)(local_158 + 1));
    }
    generate_tag_class(local_148,local_d0);
    if (local_a8 != (namespace_t **)0x0) {
      operator_delete(local_a8,(long)local_98 - (long)local_a8);
    }
  } while( true );
}

Assistant:

void
cpp_generator_t::generate( std::ostream & stream ) const
{
	unsigned long long index = 0;

	namespace_stack_t nms;

	cfg::const_class_ptr_t c = 0;

	const std::string guard = m_model.include_guard() +
		std::string( "__INCLUDED" );

	stream << std::string( "\n#ifndef " ) << guard
		<< std::string( "\n#define " ) << guard
		<< std::string( "\n\n" );

	generate_includes( stream, m_model.global_includes(),
		m_model.relative_includes() );

	while( ( c = m_model.next_class( index ) ) )
	{
		++index;

		namespace_stack_t tmp;

		const_namespace_ptr_t n = c->parent_namespace();

		while( n )
		{
			if( !n->name().empty() )
				tmp.push_back( n );

			n = n->parent_namespace();
		}

		if( !tmp.empty() )
		{
			std::reverse( tmp.begin(), tmp.end() );

			while( !nms.empty() && nms.back() != tmp.back() )
				close_namespace( stream, nms );

			if( nms.empty() )
			{
				nms.swap( tmp );

				start_namespaces( stream, nms );
			}
		}
		else
		{
			while( !nms.empty() )
				close_namespace( stream, nms );
		}

		generate_cpp_classes( stream, c );
	}

	while( !nms.empty() )
		close_namespace( stream, nms );

	stream << std::string( "#endif // " ) << guard
		<< std::string( "\n" );
}